

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTcPrsOpIfnil::parse(CTcPrsOpIfnil *this)

{
  int iVar1;
  CTcPrsNode *pCVar2;
  CTcPrsNode *pCVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTcPrsNode *pCVar4;
  size_t in_RSI;
  
  pCVar2 = CTcPrsOpBin::parse(&S_op_or.super_CTcPrsOpBin);
  if (pCVar2 != (CTcPrsNode *)0x0) {
    if ((G_tok->curtok_).typ_ != TOKT_QQ) {
      return pCVar2;
    }
    CTcTokenizer::next(G_tok);
    pCVar3 = CTcPrsOpAsi::parse(&S_op_asi);
    if (pCVar3 != (CTcPrsNode *)0x0) {
      iVar1 = (*(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(pCVar2);
      if (CONCAT44(extraout_var,iVar1) == 0) {
        pCVar4 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,in_RSI);
        pCVar4[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar2;
        pCVar4[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar3;
        (pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00353718;
        return pCVar4;
      }
      iVar1 = (*(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(pCVar2);
      if (*(int *)CONCAT44(extraout_var_00,iVar1) != 1) {
        return pCVar2;
      }
      return pCVar3;
    }
  }
  return (CTcPrsNode *)0x0;
}

Assistant:

CTcPrsNode *CTcPrsOpIfnil::parse() const
{
    /* parse the conditional part */
    CTcPrsNode *first = S_op_or.parse();
    if (first == 0)
        return 0;

    /* if we're not looking at the '??' operator, we're done */
    if (G_tok->cur() != TOKT_QQ)
        return first;

    /* skip the '??' operator */
    G_tok->next();

    /* 
     *   parse the second part, which can be any expression except ',', since
     *   we have higher precedence than ',' 
     */
    CTcPrsNode *second = G_prs->parse_expr_or_dstr(FALSE);
    if (second == 0)
        return 0;

    /* if the first expression is constant, we can fold immediately */
    if (first->is_const())
    {
        /* if it's nil, yield the second value, otherwise yield the first */
        return (first->get_const_val()->get_type() == TC_CVT_NIL
                ? second : first);
    }
    else
    {
        /* it's not a constant value - return a new if-nil node */
        return new CTPNIfnil(first, second);
    }
}